

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O1

uint16_t object_pack_total(player *p,object *obj,_Bool ignore_inscrip,object **first)

{
  ushort uVar1;
  bool bVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  object **ppoVar6;
  char cVar7;
  uint16_t uVar8;
  object *obj2;
  
  if (first != (object **)0x0) {
    *first = (object *)0x0;
  }
  obj2 = p->gear;
  uVar8 = 0;
  if (obj2 != (object *)0x0) {
    cVar7 = '\0';
    uVar8 = 0;
    do {
      if (obj2 == obj) {
        uVar1 = (p->body).count;
        if (uVar1 == 0) {
          uVar5 = 0;
        }
        else {
          ppoVar6 = &((p->body).slots)->obj;
          uVar4 = 0;
          do {
            uVar5 = uVar4;
            if (*ppoVar6 == obj) break;
            uVar4 = uVar4 + 1;
            ppoVar6 = ppoVar6 + 4;
            uVar5 = (ulong)uVar1;
          } while (uVar1 != uVar4);
        }
        bVar2 = (int)(uint)uVar1 <= (int)uVar5;
      }
      else if (ignore_inscrip) {
        bVar2 = object_similar(obj,obj2,OSTACK_PACK);
      }
      else {
        bVar2 = object_stackable(obj,obj2,OSTACK_PACK);
      }
      if ((bVar2 == false) || (uVar8 = uVar8 + obj2->number, first == (object **)0x0))
      goto LAB_00195b4b;
      cVar3 = gear_to_label(p,obj2);
      if (*first == (object *)0x0) {
LAB_00195b46:
        *first = obj2;
        cVar7 = cVar3;
      }
      else if ((byte)(cVar3 + 0x9fU) < 0x1a) {
        if ((cVar7 == '\0') || ((byte)(cVar7 + 0x9fU) < 0x1a && cVar3 < cVar7)) goto LAB_00195b46;
      }
      else if (((byte)(cVar3 - 0x30U) < 10) &&
              (((byte)(cVar7 + 0x9fU) < 0x1a || cVar7 == '\0' ||
               (cVar3 < cVar7 && (byte)(cVar7 - 0x30U) < 10)))) goto LAB_00195b46;
LAB_00195b4b:
      obj2 = obj2->next;
    } while (obj2 != (object *)0x0);
  }
  return uVar8;
}

Assistant:

uint16_t object_pack_total(struct player *p, const struct object *obj,
		bool ignore_inscrip, struct object **first)
{
	uint16_t total = 0;
	char first_label = '\0';
	struct object *cursor;

	if (first) {
		*first = NULL;
	}
	for (cursor = p->gear; cursor; cursor = cursor->next) {
		bool like;

		if (cursor == obj) {
			/*
			 * object_similar() excludes cursor == obj so if
			 * obj is not equipped, account for it here.
			 */
			like = !object_is_equipped(p->body, obj);
		} else if (ignore_inscrip) {
			like = object_similar(obj, cursor, OSTACK_PACK);
		} else {
			like = object_stackable(obj, cursor, OSTACK_PACK);
		}
		if (like) {
			total += cursor->number;
			if (first) {
				char test_label = gear_to_label(p, cursor);

				if (!*first) {
					*first = cursor;
					first_label = test_label;
				} else {
					if (test_label >= 'a'
							&& test_label <= 'z') {
						if (first_label == '\0'
								|| (first_label >= 'a'
								&& first_label <= 'z'
								&& test_label < first_label)) {
							*first = cursor;
							first_label = test_label;
						}
					} else if (test_label >= '0'
							&& test_label <= '9') {
						if (first_label == '\0'
								|| (first_label >= 'a'
								&& first_label <= 'z')
								|| (first_label >= '0'
								&& first_label <= '9'
								&& test_label < first_label)) {
							*first = cursor;
							first_label = test_label;
						}
					}
				}
			}
		}
	}

	return total;
}